

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Window.cpp
# Opt level: O2

bool __thiscall cursespp::Window::IsParentVisible(Window *this)

{
  int iVar1;
  undefined4 extraout_var;
  bool bVar3;
  _func_int **pp_Var2;
  
  if (this->parent == (IWindow *)0x0) {
    bVar3 = true;
  }
  else {
    pp_Var2 = (this->super_IWindow).super_IOrderable._vptr_IOrderable;
    while( true ) {
      iVar1 = (*pp_Var2[0x25])(this);
      this = (Window *)CONCAT44(extraout_var,iVar1);
      bVar3 = this == (Window *)0x0;
      if (bVar3) break;
      iVar1 = (*(this->super_IWindow).super_IOrderable._vptr_IOrderable[0x23])(this);
      if ((char)iVar1 == '\0') {
        return bVar3;
      }
      pp_Var2 = (this->super_IWindow).super_IOrderable._vptr_IOrderable;
    }
  }
  return bVar3;
}

Assistant:

bool Window::IsParentVisible() {
    ASSERT_MAIN_THREAD();

    if (this->parent == nullptr) {
        return true;
    }

    auto p = this->GetParent();
    while (p) {
        if (!p->IsVisible()) {
            return false;
        }
        p = p->GetParent();
    }

    return true;
}